

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_CURSE_ARMOR(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  int16_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  object *obj;
  int iVar7;
  int iVar8;
  char o_name [80];
  char local_88 [88];
  
  obj = equipped_item_by_slot_name(player,"body");
  if (obj != (object *)0x0) {
    object_desc(local_88,0x50,obj,3,player);
    if ((obj->artifact == (artifact *)0x0) || (uVar5 = Rand_div(100), 0x31 < (int)uVar5)) {
      uVar5 = Rand_div(3);
      msg("A terrible black aura blasts your %s!",local_88);
      uVar6 = Rand_div(3);
      obj->to_a = obj->to_a + ~(ushort)uVar6;
      iVar7 = uVar5 + 1;
      if (iVar7 != 0) {
        iVar8 = 0x14;
        do {
          uVar5 = Rand_div(z_info->curse_max - 1);
          iVar4 = m_bonus(9,(int)player->depth);
          if (curses[uVar5 + L'\x01'].poss[obj->tval] == false) {
            iVar8 = iVar8 + -1;
          }
          else {
            append_object_curse(obj,uVar5 + L'\x01',iVar4 * 10);
            iVar7 = iVar7 + -1;
          }
        } while ((iVar7 != 0) && (iVar8 != 0));
      }
      ppVar3 = player->upkeep;
      puVar1 = &ppVar3->update;
      *puVar1 = *puVar1 | 9;
      pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
      *pbVar2 = *pbVar2 | 6;
    }
    else {
      msg("A %s tries to %s, but your %s resists the effects!","terrible black aura",
          "surround your armor",local_88);
    }
    context->ident = true;
    return true;
  }
  return true;
}

Assistant:

bool effect_handler_CURSE_ARMOR(effect_handler_context_t *context)
{
	struct object *obj;

	char o_name[80];

	/* Curse the body armor */
	obj = equipped_item_by_slot_name(player, "body");

	/* Nothing to curse */
	if (!obj) return (true);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, player);

	/* Attempt a saving throw for artifacts */
	if (obj->artifact && (randint0(100) < 50)) {
		msg("A %s tries to %s, but your %s resists the effects!",
				   "terrible black aura", "surround your armor", o_name);
	} else {
		int num = randint1(3);
		int max_tries = 20;
		msg("A terrible black aura blasts your %s!", o_name);

		/* Take down bonus a wee bit */
		obj->to_a -= randint1(3);

		/* Try to find enough appropriate curses */
		while (num && max_tries) {
			int pick = randint1(z_info->curse_max - 1);
			int power = 10 * m_bonus(9, player->depth);
			if (!curses[pick].poss[obj->tval]) {
				max_tries--;
				continue;
			}
			append_object_curse(obj, pick, power);
			num--;
		}

		/* Recalculate bonuses */
		player->upkeep->update |= (PU_BONUS);

		/* Recalculate mana */
		player->upkeep->update |= (PU_MANA);

		/* Window stuff */
		player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	}

	context->ident = true;

	return (true);
}